

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

tnt_error tnt_io_nonblock(tnt_stream_net *s,int set)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  uVar1 = fcntl(s->fd,3);
  if ((uVar1 != 0xffffffff) &&
     (iVar2 = fcntl(s->fd,4,(ulong)((uint)(set != 0) << 0xb | uVar1 & 0xfffff7ff)), iVar2 != -1)) {
    return TNT_EOK;
  }
  piVar3 = __errno_location();
  s->errno_ = *piVar3;
  return TNT_ESYSTEM;
}

Assistant:

static enum tnt_error
tnt_io_nonblock(struct tnt_stream_net *s, int set)
{
	int flags = fcntl(s->fd, F_GETFL);
	if (flags == -1) {
		s->errno_ = errno;
		return TNT_ESYSTEM;
	}
	if (set)
		flags |= O_NONBLOCK;
	else
		flags &= ~O_NONBLOCK;
	if (fcntl(s->fd, F_SETFL, flags) == -1) {
		s->errno_ = errno;
		return TNT_ESYSTEM;
	}
	return TNT_EOK;
}